

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_valid_public_key(uint8_t *public_key)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  uECC_word_t local_98;
  uECC_word_t tmp1 [4];
  uECC_word_t tmp2 [4];
  EccPoint public;
  
  vli_bytesToNative(tmp2 + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  lVar3 = 0;
  do {
    if (tmp2[lVar3 + 3] != 0) goto LAB_00117800;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  while (public.x[lVar3 + 3] == 0) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      return 0;
    }
  }
LAB_00117800:
  uVar5 = 3;
  while( true ) {
    iVar4 = (int)uVar5;
    puVar1 = curve_p + uVar5;
    lVar3 = uVar5 + 3;
    if (tmp2[lVar3] < *puVar1) {
      uVar5 = 3;
      while( true ) {
        iVar4 = (int)uVar5;
        puVar1 = curve_p + uVar5;
        lVar3 = uVar5 + 3;
        if (public.x[lVar3] < *puVar1) {
          vli_modSquare_fast(&local_98,public.x + 3);
          curve_x_side(tmp1 + 3,tmp2 + 3);
          uVar2 = 3;
          do {
            if (tmp1[(ulong)uVar2 - 1] != tmp1[(ulong)uVar2 + 3]) {
              return 0;
            }
            bVar6 = uVar2 != 0;
            uVar2 = uVar2 - 1;
          } while (bVar6);
          return 1;
        }
        uVar5 = (ulong)(iVar4 - 1);
        if (iVar4 == 0) break;
        if (*puVar1 < public.x[lVar3]) {
          return 0;
        }
      }
      return 0;
    }
    uVar5 = (ulong)(iVar4 - 1);
    if (iVar4 == 0) break;
    if (*puVar1 < tmp2[lVar3]) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int uECC_valid_public_key(const uint8_t public_key[uECC_BYTES*2]) {
    uECC_word_t tmp1[uECC_WORDS];
    uECC_word_t tmp2[uECC_WORDS];
    EccPoint public;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

    // The point at infinity is invalid.
    if (EccPoint_isZero(&public)) {
        return 0;
    }

    // x and y must be smaller than p.
    if (vli_cmp(curve_p, public.x) != 1 || vli_cmp(curve_p, public.y) != 1) {
        return 0;
    }

    vli_modSquare_fast(tmp1, public.y); /* tmp1 = y^2 */
    curve_x_side(tmp2, public.x); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (vli_cmp(tmp1, tmp2) == 0);
}